

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hpp
# Opt level: O3

void cppurses::System::post_event<cppurses::Timer_event,cppurses::Widget&>(Widget *args)

{
  tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_> this;
  pointer *__ptr;
  __uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_> local_18;
  
  this.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
  super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
       operator_new(0x18);
  Timer_event::Timer_event
            ((Timer_event *)
             this.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
             super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl,args);
  local_18._M_t.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
  super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl =
       (tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
       (tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
       this.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
       super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl;
  post_event((unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> *)&local_18);
  if ((_Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
      local_18._M_t.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
      .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl != (Event *)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
                          .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

static void post_event(Args&&... args)
    {
        auto event = std::make_unique<T>(std::forward<Args>(args)...);
        System::post_event(std::move(event));
    }